

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O2

void perf_compute_response_all_layers
               (_func_void_fasthessian_ptr *function,fasthessian *fh,benchmark_data *data)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  long lVar5;
  long num_runs;
  long lVar6;
  long lVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_ZMM2 [64];
  double local_78;
  double local_70;
  vector<double,_std::allocator<double>_> cycleslist;
  
  lVar6 = 5;
  dVar10 = 1.0;
  do {
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    lVar6 = (long)(dVar10 * (double)lVar6);
    lVar7 = lVar6;
    while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
      (*function)(fh);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    auVar9 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) - (uVar1 & 0xffffffff)
                                ) + (uVar2 & 0xffffffff) + (uVar2 & 0xffffffff00000000));
    local_70 = auVar9._0_8_;
    dVar10 = 100000000.0 / local_70;
  } while (2.0 < dVar10);
  cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78 = 0.0;
  for (lVar7 = 0; lVar7 != 10; lVar7 = lVar7 + 1) {
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    lVar5 = lVar6;
    while (bVar8 = lVar5 != 0, lVar5 = lVar5 + -1, bVar8) {
      (*function)(fh);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    auVar9 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) - (uVar1 & 0xffffffff)
                                ) + (uVar2 & 0xffffffff) + (uVar2 & 0xffffffff00000000));
    dVar10 = auVar9._0_8_ / (double)lVar6;
    local_70 = dVar10;
    std::vector<double,_std::allocator<double>_>::push_back(&cycleslist,&local_70);
    local_78 = local_78 + dVar10;
  }
  lVar6 = *(long *)(data + 0x210);
  local_70 = local_78 / 10.0;
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  auVar14._8_8_ = 0x3fdfffffffffffff;
  auVar14._0_8_ = 0x3fdfffffffffffff;
  auVar11._0_8_ = ((double)lVar6 * 100.0) / (local_78 / 10.0);
  auVar11._8_8_ = 0;
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar9 = vpternlogq_avx512vl(auVar14,auVar11,auVar3,0xf8);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = auVar11._0_8_ + auVar9._0_8_;
  auVar3 = vroundsd_avx(auVar12,auVar12,0xb);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_70;
  auVar9 = vmovhps_avx(auVar13,*cycleslist.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
  auVar9 = vcvttpd2uqq_avx512vl(auVar9);
  *(undefined1 (*) [16])(data + 0x218) = auVar9;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1];
  uVar4 = vcvttsd2usi_avx512f(auVar9);
  *(undefined8 *)(data + 0x228) = uVar4;
  *(double *)(data + 0x230) = auVar3._0_8_ / 100.0;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&cycleslist.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void perf_compute_response_all_layers(void (*function)(struct fasthessian *), struct fasthessian *fh,
                                      struct benchmark_data &data) {
    double cycles = 0.;
    long num_runs = 5;
    double multiplier = 1;
    uint64_t start, end;

#ifdef WARM_UP
    // Warm-up phase: we determine a number of executions that allows
    // the code to be executed for at least CYCLES_REQUIRED cycles.
    // This helps excluding timing overhead when measuring small runtimes.
    do {
        num_runs = num_runs * multiplier;
        start = start_tsc();
        for (size_t i = 0; i < num_runs; i++) {
            // TODO: (carla) should we do a warm up on more than one layer? feels like an overkill.
            (*function)(fh);
        }
        end = stop_tsc(start);

        cycles = (double)end;
        multiplier = (CYCLES_REQUIRED) / (cycles);

    } while (multiplier > 2);
#endif

    std::vector<double> cycleslist;

    // Actual performance measurements repeated REP times.
    // We simply store all results and compute medians during post-processing.
    double total_cycles = 0;
    for (size_t j = 0; j < REP; j++) {
        start = start_tsc();
        for (size_t i = 0; i < num_runs; ++i) {
            (*function)(fh);
        }
        end = stop_tsc(start);

        cycles = ((double)end) / num_runs;
        total_cycles += cycles;

        cycleslist.push_back(cycles);
    }
    total_cycles /= REP;
    // total_cycles /= MAX(1, fh->total_layers);
    cycles = total_cycles;  // cyclesList.front();
    double flops_per_cycle = round((100.0 * data.num_flops) / cycles) / 100.0;
    std::sort(cycleslist.begin(), cycleslist.end());
    data.avg_cycles = (uint64_t)cycles;
    data.min_cycles = (uint64_t)cycleslist.front();  // / MAX(1, fh->total_layers);
    data.max_cycles = (uint64_t)cycleslist.back();   // / MAX(1, fh->total_layers);
    // TODO: (carla) do we have to divide by total_lyers here? the total_cycles have already been divided;
    data.flops_per_cycle = flops_per_cycle;
}